

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O0

int32_t __thiscall helics::PublicationInfo::getProperty(PublicationInfo *this,int32_t option)

{
  size_type sVar1;
  rep rVar2;
  int in_ESI;
  long in_RDI;
  bool flagval;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffffc8;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  bool local_15;
  
  local_15 = false;
  if (in_ESI == 0x18d) {
    local_15 = (bool)(*(byte *)(in_RDI + 0xea) & 1);
  }
  else if (in_ESI == 0x192) {
    local_15 = (bool)((*(byte *)(in_RDI + 0xea) ^ 0xff) & 1);
  }
  else if (in_ESI == 0x197) {
    local_15 = *(int *)(in_RDI + 0xec) == 1;
  }
  else if (in_ESI == 0x199) {
    local_15 = *(int *)(in_RDI + 0xec) != 1;
  }
  else if (in_ESI == 0x19b) {
    local_15 = (bool)(*(byte *)(in_RDI + 0xeb) & 1);
  }
  else if (in_ESI == 0x1c4) {
    local_15 = (bool)(*(byte *)(in_RDI + 0xe9) & 1);
  }
  else {
    if (in_ESI == 0x20a) {
      sVar1 = std::
              vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
              ::size((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                      *)(in_RDI + 8));
      return (int32_t)sVar1;
    }
    if (in_ESI == 0x22d) {
      local_20.__r = (rep)TimeRepresentation<count_time<9,_long>_>::to_ms(in_stack_ffffffffffffffc8)
      ;
      rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_20);
      return (int32_t)rVar2;
    }
  }
  return (uint)(local_15 != false);
}

Assistant:

int32_t PublicationInfo::getProperty(int32_t option) const
{
    bool flagval = false;
    switch (option) {
        case defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE:
            flagval = only_update_on_change;
            break;
        case defs::Options::CONNECTION_REQUIRED:
            flagval = required;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            flagval = !required;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            flagval = (requiredConnections == 1);
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            flagval = requiredConnections != 1;
            break;
        case defs::Options::BUFFER_DATA:
            flagval = buffer_data;
            break;
        case defs::Options::CONNECTIONS:
            return static_cast<int32_t>(subscribers.size());
        case defs::Options::TIME_RESTRICTED:
            return static_cast<std::int32_t>(minTimeGap.to_ms().count());
        default:
            break;
    }
    return flagval ? 1 : 0;
}